

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

quicly_conn_t *
create_connection(quicly_context_t *ctx,uint32_t protocol_version,char *server_name,
                 sockaddr *remote_addr,sockaddr *param_5,ptls_iovec_t *remote_cid,
                 quicly_cid_plaintext_t *param_7,ptls_handshake_properties_t *handshake_properties,
                 uint32_t initcwnd)

{
  st_quicly_default_scheduler_state_t *psVar1;
  quicly_linklist_t *pqVar2;
  anon_struct_48_2_64f3ff10_for_pending_streams *paVar3;
  undefined1 *puVar4;
  uint uVar5;
  quicly_context_t *pqVar6;
  st_quicly_init_cc_t *psVar7;
  st_quicly_update_open_count_t *psVar8;
  undefined8 uVar9;
  int iVar10;
  ptls_t *tls;
  size_t server_name_len;
  quicly_conn_t *conn;
  quicly_stream_id_t qVar11;
  kh_quicly_stream_t_t *pkVar12;
  uint64_t uVar13;
  void **ppvVar14;
  quicly_stream_id_t qVar15;
  long lVar16;
  quicly_transport_parameters_t *pqVar17;
  quicly_transport_parameters_t *pqVar18;
  ptls_handshake_properties_t *ppVar19;
  bool bVar20;
  byte bVar21;
  
  bVar21 = 0;
  if ((remote_addr == (sockaddr *)0x0) || (remote_addr->sa_family == 0)) {
    __assert_fail("remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7e8,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  if (((ctx->transport_params).max_datagram_frame_size != 0) &&
     (ctx->receive_datagram_frame == (quicly_receive_datagram_frame_t *)0x0)) {
    __assert_fail("ctx->receive_datagram_frame != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7ea,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  if (server_name == (char *)0x0) {
    tls = ptls_server_new(ctx->tls);
    if (tls == (ptls_t *)0x0) {
      return (quicly_conn_t *)0x0;
    }
  }
  else {
    tls = ptls_client_new(ctx->tls);
    if (tls == (ptls_t *)0x0) {
      return (quicly_conn_t *)0x0;
    }
    server_name_len = strlen(server_name);
    iVar10 = ptls_set_server_name(tls,server_name,server_name_len);
    if (iVar10 != 0) goto LAB_001165a1;
  }
  conn = (quicly_conn_t *)calloc(1,0x9e8);
  if (conn != (quicly_conn_t *)0x0) {
    (conn->super).ctx = ctx;
    lock_now(conn,0);
    set_address(&(conn->super).local.address,param_5);
    set_address(&(conn->super).remote.address,remote_addr);
    quicly_local_cid_init_set(&(conn->super).local.cid_set,ctx->cid_encryptor,param_7);
    *(undefined8 *)((conn->super).local.long_header_src_cid.cid + 0xd) =
         *(undefined8 *)((conn->super).local.cid_set.cids[0].cid.cid + 0xd);
    uVar9 = *(undefined8 *)((conn->super).local.cid_set.cids[0].cid.cid + 8);
    *(undefined8 *)(conn->super).local.long_header_src_cid.cid =
         *(undefined8 *)(conn->super).local.cid_set.cids[0].cid.cid;
    *(undefined8 *)((conn->super).local.long_header_src_cid.cid + 8) = uVar9;
    quicly_remote_cid_init_set(&(conn->super).remote.cid_set,remote_cid,ctx->tls->random_bytes);
    (conn->super).state = QUICLY_STATE_FIRSTFLIGHT;
    bVar20 = server_name == (char *)0x0;
    if (bVar20) {
      qVar11 = 2;
      qVar15 = 3;
    }
    else {
      qVar11 = 3;
      qVar15 = 2;
    }
    (conn->super).local.bidi.next_stream_id = (ulong)bVar20;
    (conn->super).local.uni.next_stream_id = qVar15;
    (conn->super).remote.bidi.next_stream_id = (ulong)!bVar20;
    (conn->super).remote.uni.next_stream_id = qVar11;
    pqVar17 = &default_transport_params;
    pqVar18 = &(conn->super).remote.transport_params;
    for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
      (pqVar18->max_stream_data).bidi_local = (pqVar17->max_stream_data).bidi_local;
      pqVar17 = (quicly_transport_parameters_t *)((long)pqVar17 + ((ulong)bVar21 * -2 + 1) * 8);
      pqVar18 = (quicly_transport_parameters_t *)((long)pqVar18 + (ulong)bVar21 * -0x10 + 8);
    }
    (conn->super).version = protocol_version;
    (conn->super).remote.largest_retire_prior_to = 0;
    psVar1 = &(conn->super)._default_scheduler;
    (conn->super)._default_scheduler.active.next = &psVar1->active;
    (conn->super)._default_scheduler.active.prev = &psVar1->active;
    pqVar2 = &(conn->super)._default_scheduler.blocked;
    (conn->super)._default_scheduler.blocked.next = pqVar2;
    (conn->super)._default_scheduler.blocked.prev = pqVar2;
    pkVar12 = (kh_quicly_stream_t_t *)calloc(1,0x28);
    conn->streams = pkVar12;
    pqVar6 = (conn->super).ctx;
    uVar13 = (pqVar6->transport_params).max_data;
    (conn->ingress).max_data.sender.max_committed = uVar13;
    (conn->ingress).max_data.sender.max_acked = uVar13;
    (conn->ingress).max_data.sender.num_inflight = 0;
    puVar4 = &(conn->ingress).max_data.sender.field_0x18;
    *puVar4 = *puVar4 & 0xfe;
    uVar13 = (pqVar6->transport_params).max_streams_uni;
    (conn->ingress).max_streams.uni.max_committed = uVar13;
    (conn->ingress).max_streams.uni.max_acked = uVar13;
    (conn->ingress).max_streams.uni.num_inflight = 0;
    puVar4 = &(conn->ingress).max_streams.uni.field_0x18;
    *puVar4 = *puVar4 & 0xfe;
    uVar13 = (pqVar6->transport_params).max_streams_bidi;
    (conn->ingress).max_streams.bidi.max_committed = uVar13;
    (conn->ingress).max_streams.bidi.max_acked = uVar13;
    (conn->ingress).max_streams.bidi.num_inflight = 0;
    puVar4 = &(conn->ingress).max_streams.bidi.field_0x18;
    *puVar4 = *puVar4 & 0xfe;
    uVar5 = (pqVar6->loss).default_initial_rtt;
    (conn->egress).loss.conf = &pqVar6->loss;
    (conn->egress).loss.max_ack_delay = &(conn->super).remote.transport_params.max_ack_delay;
    (conn->egress).loss.ack_delay_exponent =
         &(conn->super).remote.transport_params.ack_delay_exponent;
    (conn->egress).loss.pto_count = '\0';
    (conn->egress).loss.time_of_last_packet_sent = 0;
    (conn->egress).loss.largest_acked_packet_plus1[0] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[1] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[2] = 0;
    *(undefined1 (*) [16])((conn->egress).loss.largest_acked_packet_plus1 + 3) =
         (undefined1  [16])0x0;
    (conn->egress).loss.loss_time = 0x7fffffffffffffff;
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    (conn->egress).loss.rtt.minimum = 0xffffffff;
    (conn->egress).loss.rtt.latest = 0;
    (conn->egress).loss.rtt.smoothed = uVar5;
    (conn->egress).loss.rtt.variance = uVar5 >> 1;
    (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
    (conn->egress).loss.sentmap.head = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.tail = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.num_packets = 0;
    (conn->egress).loss.sentmap.bytes_in_flight = 0;
    uVar13 = calc_next_pn_to_skip
                       (pqVar6->tls,0,initcwnd,(ulong)pqVar6->initial_egress_max_udp_payload_size);
    (conn->egress).next_pn_to_skip = uVar13;
    pqVar6 = (conn->super).ctx;
    (conn->egress).max_udp_payload_size = pqVar6->initial_egress_max_udp_payload_size;
    (conn->egress).max_streams.uni.count = 0;
    *(undefined4 *)&(conn->egress).max_streams.uni.blocked_sender.max_committed = 0xffffffff;
    *(undefined4 *)((long)&(conn->egress).max_streams.uni.blocked_sender.max_committed + 4) =
         0xffffffff;
    *(undefined4 *)&(conn->egress).max_streams.uni.blocked_sender.max_acked = 0xffffffff;
    *(undefined4 *)((long)&(conn->egress).max_streams.uni.blocked_sender.max_acked + 4) = 0xffffffff
    ;
    (conn->egress).max_streams.uni.blocked_sender.num_inflight = 0;
    puVar4 = &(conn->egress).max_streams.uni.blocked_sender.field_0x18;
    *puVar4 = *puVar4 & 0xfe;
    (conn->egress).max_streams.bidi.count = 0;
    *(undefined4 *)&(conn->egress).max_streams.bidi.blocked_sender.max_committed = 0xffffffff;
    *(undefined4 *)((long)&(conn->egress).max_streams.bidi.blocked_sender.max_committed + 4) =
         0xffffffff;
    *(undefined4 *)&(conn->egress).max_streams.bidi.blocked_sender.max_acked = 0xffffffff;
    *(undefined4 *)((long)&(conn->egress).max_streams.bidi.blocked_sender.max_acked + 4) =
         0xffffffff;
    (conn->egress).max_streams.bidi.blocked_sender.num_inflight = 0;
    puVar4 = &(conn->egress).max_streams.bidi.blocked_sender.field_0x18;
    *puVar4 = *puVar4 & 0xfe;
    (conn->egress).path_challenge.tail_ref = &(conn->egress).path_challenge.head;
    (conn->egress).ack_frequency.update_at = 0x7fffffffffffffff;
    (conn->egress).send_ack_at = 0x7fffffffffffffff;
    psVar7 = pqVar6->init_cc;
    (*psVar7->cb)(psVar7,&(conn->egress).cc,initcwnd,(conn->stash).now);
    quicly_retire_cid_init(&(conn->egress).retire_cid);
    paVar3 = &(conn->egress).pending_streams;
    (conn->egress).pending_streams.blocked.uni.next = (st_quicly_linklist_t *)paVar3;
    (conn->egress).pending_streams.blocked.uni.prev = (st_quicly_linklist_t *)paVar3;
    pqVar2 = &(conn->egress).pending_streams.blocked.bidi;
    (conn->egress).pending_streams.blocked.bidi.next = pqVar2;
    (conn->egress).pending_streams.blocked.bidi.prev = pqVar2;
    pqVar2 = &(conn->egress).pending_streams.control;
    (conn->egress).pending_streams.control.next = pqVar2;
    (conn->egress).pending_streams.control.prev = pqVar2;
    (conn->crypto).tls = tls;
    if (handshake_properties == (ptls_handshake_properties_t *)0x0) {
      (conn->crypto).handshake_properties.collect_extension =
           (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
      (conn->crypto).handshake_properties.collected_extensions =
           (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
      *(undefined1 (*) [16])((long)&(conn->crypto).handshake_properties.field_0 + 0x60) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(conn->crypto).handshake_properties.field_0 + 0x50) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(conn->crypto).handshake_properties.field_0 + 0x40) =
           (undefined1  [16])0x0;
      *(uint8_t **)((long)&(conn->crypto).handshake_properties.field_0 + 0x30) = (uint8_t *)0x0;
      *(size_t *)((long)&(conn->crypto).handshake_properties.field_0 + 0x38) = 0;
      *(undefined1 (*) [16])((long)&(conn->crypto).handshake_properties.field_0 + 0x20) =
           (undefined1  [16])0x0;
      *(uint8_t **)((long)&(conn->crypto).handshake_properties.field_0 + 0x10) = (uint8_t *)0x0;
      *(size_t *)((long)&(conn->crypto).handshake_properties.field_0 + 0x18) = 0;
      *(ptls_iovec_t **)&(conn->crypto).handshake_properties.field_0 = (ptls_iovec_t *)0x0;
      *(size_t *)((long)&(conn->crypto).handshake_properties.field_0 + 8) = 0;
    }
    else {
      if (handshake_properties->additional_extensions != (ptls_raw_extension_t *)0x0) {
        __assert_fail("handshake_properties->additional_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x828,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      if (handshake_properties->collect_extension !=
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0) {
        __assert_fail("handshake_properties->collect_extension == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x829,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      if (handshake_properties->collected_extensions !=
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0) {
        __assert_fail("handshake_properties->collected_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x82a,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      ppVar19 = &(conn->crypto).handshake_properties;
      for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
        (ppVar19->field_0).client.negotiated_protocols.list =
             (handshake_properties->field_0).client.negotiated_protocols.list;
        handshake_properties =
             (ptls_handshake_properties_t *)((long)handshake_properties + (ulong)bVar21 * -0x10 + 8)
        ;
        ppVar19 = (ptls_handshake_properties_t *)((long)ppVar19 + (ulong)bVar21 * -0x10 + 8);
      }
    }
    (conn->crypto).handshake_properties.collect_extension = collect_transport_parameters;
    (conn->retry_scid).len = 0xff;
    (conn->idle_timeout).at = 0x7fffffffffffffff;
    puVar4 = &(conn->idle_timeout).field_0x8;
    *puVar4 = *puVar4 | 1;
    (conn->stash).on_ack_stream.active_acked_cache.stream_id = -0x8000000000000000;
    ppvVar14 = ptls_get_data_ptr(tls);
    *ppvVar14 = conn;
    psVar8 = ((conn->super).ctx)->update_open_count;
    if (psVar8 != (st_quicly_update_open_count_t *)0x0) {
      (*psVar8->cb)(psVar8,1);
      return conn;
    }
    return conn;
  }
LAB_001165a1:
  ptls_free(tls);
  return (quicly_conn_t *)0x0;
}

Assistant:

static quicly_conn_t *create_connection(quicly_context_t *ctx, uint32_t protocol_version, const char *server_name,
                                        struct sockaddr *remote_addr, struct sockaddr *local_addr, ptls_iovec_t *remote_cid,
                                        const quicly_cid_plaintext_t *local_cid, ptls_handshake_properties_t *handshake_properties,
                                        uint32_t initcwnd)
{
    ptls_t *tls = NULL;
    quicly_conn_t *conn;

    /* consistency checks */
    assert(remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC);
    if (ctx->transport_params.max_datagram_frame_size != 0)
        assert(ctx->receive_datagram_frame != NULL);

    /* create TLS context */
    if ((tls = ptls_new(ctx->tls, server_name == NULL)) == NULL)
        return NULL;
    if (server_name != NULL && ptls_set_server_name(tls, server_name, strlen(server_name)) != 0) {
        ptls_free(tls);
        return NULL;
    }

    /* allocate memory and start creating QUIC context */
    if ((conn = malloc(sizeof(*conn))) == NULL) {
        ptls_free(tls);
        return NULL;
    }
    memset(conn, 0, sizeof(*conn));
    conn->super.ctx = ctx;
    lock_now(conn, 0);
    set_address(&conn->super.local.address, local_addr);
    set_address(&conn->super.remote.address, remote_addr);
    quicly_local_cid_init_set(&conn->super.local.cid_set, ctx->cid_encryptor, local_cid);
    conn->super.local.long_header_src_cid = conn->super.local.cid_set.cids[0].cid;
    quicly_remote_cid_init_set(&conn->super.remote.cid_set, remote_cid, ctx->tls->random_bytes);
    conn->super.state = QUICLY_STATE_FIRSTFLIGHT;
    if (server_name != NULL) {
        conn->super.local.bidi.next_stream_id = 0;
        conn->super.local.uni.next_stream_id = 2;
        conn->super.remote.bidi.next_stream_id = 1;
        conn->super.remote.uni.next_stream_id = 3;
    } else {
        conn->super.local.bidi.next_stream_id = 1;
        conn->super.local.uni.next_stream_id = 3;
        conn->super.remote.bidi.next_stream_id = 0;
        conn->super.remote.uni.next_stream_id = 2;
    }
    conn->super.remote.transport_params = default_transport_params;
    conn->super.version = protocol_version;
    conn->super.remote.largest_retire_prior_to = 0;
    quicly_linklist_init(&conn->super._default_scheduler.active);
    quicly_linklist_init(&conn->super._default_scheduler.blocked);
    conn->streams = kh_init(quicly_stream_t);
    quicly_maxsender_init(&conn->ingress.max_data.sender, conn->super.ctx->transport_params.max_data);
    quicly_maxsender_init(&conn->ingress.max_streams.uni, conn->super.ctx->transport_params.max_streams_uni);
    quicly_maxsender_init(&conn->ingress.max_streams.bidi, conn->super.ctx->transport_params.max_streams_bidi);
    quicly_loss_init(&conn->egress.loss, &conn->super.ctx->loss,
                     conn->super.ctx->loss.default_initial_rtt /* FIXME remember initial_rtt in session ticket */,
                     &conn->super.remote.transport_params.max_ack_delay, &conn->super.remote.transport_params.ack_delay_exponent);
    conn->egress.next_pn_to_skip =
        calc_next_pn_to_skip(conn->super.ctx->tls, 0, initcwnd, conn->super.ctx->initial_egress_max_udp_payload_size);
    conn->egress.max_udp_payload_size = conn->super.ctx->initial_egress_max_udp_payload_size;
    init_max_streams(&conn->egress.max_streams.uni);
    init_max_streams(&conn->egress.max_streams.bidi);
    conn->egress.path_challenge.tail_ref = &conn->egress.path_challenge.head;
    conn->egress.ack_frequency.update_at = INT64_MAX;
    conn->egress.send_ack_at = INT64_MAX;
    conn->super.ctx->init_cc->cb(conn->super.ctx->init_cc, &conn->egress.cc, initcwnd, conn->stash.now);
    quicly_retire_cid_init(&conn->egress.retire_cid);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.uni);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.bidi);
    quicly_linklist_init(&conn->egress.pending_streams.control);
    conn->crypto.tls = tls;
    if (handshake_properties != NULL) {
        assert(handshake_properties->additional_extensions == NULL);
        assert(handshake_properties->collect_extension == NULL);
        assert(handshake_properties->collected_extensions == NULL);
        conn->crypto.handshake_properties = *handshake_properties;
    } else {
        conn->crypto.handshake_properties = (ptls_handshake_properties_t){{{{NULL}}}};
    }
    conn->crypto.handshake_properties.collect_extension = collect_transport_parameters;
    conn->retry_scid.len = UINT8_MAX;
    conn->idle_timeout.at = INT64_MAX;
    conn->idle_timeout.should_rearm_on_send = 1;
    conn->stash.on_ack_stream.active_acked_cache.stream_id = INT64_MIN;

    *ptls_get_data_ptr(tls) = conn;

    update_open_count(conn->super.ctx, 1);

    return conn;
}